

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void hermite_ss_compute(int order,double *xtab,double *weight)

{
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double local_78;
  double dp2;
  double p1;
  double local_60;
  double local_58;
  int local_4c;
  double local_48;
  double local_40;
  double local_38;
  
  local_58 = (double)order;
  local_48 = tgamma(local_58);
  local_4c = order + -1;
  local_40 = ldexp(1.0,local_4c);
  dVar5 = pow(local_58 + local_58 + 1.0,0.16666666666666666);
  if (0 < order) {
    local_48 = (local_48 * 1.7724538509055159) / local_40;
    uVar1 = order + 1U >> 1;
    local_60 = dVar5 * dVar5 * dVar5 + -1.85575 / dVar5;
    uVar3 = (ulong)(uint)order;
    local_40 = 4.94065645841247e-324;
    if (1 < uVar1) {
      local_40 = (double)(ulong)uVar1;
    }
    uVar4 = 0;
    do {
      uVar3 = uVar3 - 1;
      switch(uVar4 & 0xffffffff) {
      case 0:
        local_38 = local_60;
        break;
      case 1:
        p1 = local_38;
        dVar5 = pow(local_58,0.426);
        local_38 = (dVar5 * -1.14) / p1 + p1;
        break;
      case 2:
        dVar5 = *xtab * -0.86;
        local_38 = local_38 * 1.86;
        goto LAB_001e7750;
      case 3:
        dVar5 = xtab[1] * -0.91;
        local_38 = local_38 * 1.91;
LAB_001e7750:
        local_38 = local_38 + dVar5;
        break;
      default:
        local_38 = (local_38 + local_38) - xtab[uVar4 - 2];
      }
      hermite_ss_root(&local_38,order,&local_78,&dp2);
      xtab[uVar4] = local_38;
      weight[uVar4] = (local_48 / local_78) / dp2;
      xtab[uVar3] = -local_38;
      weight[uVar3] = weight[uVar4];
      uVar4 = uVar4 + 1;
    } while (local_40 != (double)uVar4);
  }
  if (1 < order) {
    pdVar2 = xtab + local_4c;
    uVar3 = 0;
    do {
      dVar5 = xtab[uVar3];
      xtab[uVar3] = *pdVar2;
      *pdVar2 = dVar5;
      uVar3 = uVar3 + 1;
      pdVar2 = pdVar2 + -1;
    } while ((uint)order >> 1 != uVar3);
  }
  return;
}

Assistant:

void hermite_ss_compute ( int order, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_SS_COMPUTE computes a Gauss-Hermite quadrature rule.
//
//  Discussion:
//
//    The abscissas are the zeros of the N-th order Hermite polynomial.
//
//    The integral:
//
//      Integral ( -oo < X < +oo ) exp ( - X*X ) * F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    19 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Arthur Stroud, Don Secrest.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//  Parameters:
//
//    Input, int ORDER, the order of the formula to be computed.
//
//    Output, double XTAB[ORDER], the abscissas.
//
//    Output, double WEIGHT[ORDER], the weights.
//
{
  double cc;
  double dp2;
  int i;
  double p1;
  const double r8_pi = 3.141592653589793;
  double s;
  double x;

  cc = sqrt ( r8_pi ) * tgamma ( double( order ) ) 
    / pow ( 2.0, order - 1 );

  s = pow ( 2.0 * double( order ) + 1.0, 1.0 / 6.0 );

  for ( i = 0; i < ( order + 1 ) / 2; i++ )
  {
    if ( i == 0 )
    {
      x = s * s * s - 1.85575 / s;
    }
    else if ( i == 1 )
    {
      x = x - 1.14 * pow ( double( order ), 0.426 ) / x;
    }
    else if ( i == 2 )
    {
      x = 1.86 * x - 0.86 * xtab[0];
    }
    else if ( i == 3 )
    {
      x = 1.91 * x - 0.91 * xtab[1];
    }
    else
    {
      x = 2.0 * x - xtab[i-2];
    }

    hermite_ss_root ( &x, order, &dp2, &p1 );

    xtab[i] = x;
    weight[i] = ( cc / dp2 ) / p1;

    xtab[order-i-1] = -x;
    weight[order-i-1] = weight[i];
  }
//
//  Reverse the order of the values.
//
  for ( i = 0; i < ( order / 2 ); i++ )
  {
    x               = xtab[i];
    xtab[i]         = xtab[order-1-i];
    xtab[order-1-i] = x;
  }

  return;
}